

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

void __thiscall dja::mat4::mat4(mat4 *this,vec4 *m0,vec4 *m1,vec4 *m2,vec4 *m3)

{
  float_t fVar1;
  vec4 *local_38;
  vec4 *m3_local;
  vec4 *m2_local;
  vec4 *m1_local;
  vec4 *m0_local;
  mat4 *this_local;
  
  local_38 = this->m;
  do {
    vec4::vec4(local_38,0.0);
    local_38 = local_38 + 1;
  } while (local_38 != this[1].m);
  fVar1 = m0->y;
  this->m[0].x = m0->x;
  this->m[0].y = fVar1;
  fVar1 = m0->w;
  this->m[0].z = m0->z;
  this->m[0].w = fVar1;
  fVar1 = m1->y;
  this->m[1].x = m1->x;
  this->m[1].y = fVar1;
  fVar1 = m1->w;
  this->m[1].z = m1->z;
  this->m[1].w = fVar1;
  fVar1 = m2->y;
  this->m[2].x = m2->x;
  this->m[2].y = fVar1;
  fVar1 = m2->w;
  this->m[2].z = m2->z;
  this->m[2].w = fVar1;
  fVar1 = m3->y;
  this->m[3].x = m3->x;
  this->m[3].y = fVar1;
  fVar1 = m3->w;
  this->m[3].z = m3->z;
  this->m[3].w = fVar1;
  return;
}

Assistant:

mat4::mat4(const vec4& m0, const vec4& m1, const vec4& m2, const vec4& m3)
{
    m[0] = m0;
    m[1] = m1;
    m[2] = m2;
    m[3] = m3;
}